

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_sse4.c
# Opt level: O2

__m256i * cross_sum(__m256i *__return_storage_ptr__,int32_t *buf,int stride)

{
  undefined1 auVar1 [32];
  __m256i *palVar2;
  long lVar3;
  undefined1 auVar4 [32];
  
  lVar3 = (long)(int)buf;
  palVar2 = (__m256i *)((long)__return_storage_ptr__ + lVar3 * -4 + -4);
  auVar1 = vpaddd_avx2(*(undefined1 (*) [32])((long)__return_storage_ptr__ + lVar3 * -4 + 4),
                       (undefined1  [32])*palVar2);
  auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])
                               ((long)__return_storage_ptr__[-1] + lVar3 * 4 + 0x1c));
  auVar1 = vpaddd_avx2(auVar1,*(undefined1 (*) [32])((long)*__return_storage_ptr__ + lVar3 * 4 + 4))
  ;
  auVar4 = vpaddd_avx2(*(undefined1 (*) [32])((long)__return_storage_ptr__[-1] + 0x1c),
                       *(undefined1 (*) [32])((long)__return_storage_ptr__ + lVar3 * -4));
  auVar4 = vpaddd_avx2(auVar4,(undefined1  [32])*__return_storage_ptr__);
  auVar4 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])((long)*__return_storage_ptr__ + 4));
  auVar4 = vpaddd_avx2(auVar4,*(undefined1 (*) [32])((long)*__return_storage_ptr__ + lVar3 * 4));
  auVar4 = vpaddd_avx2(auVar4,auVar1);
  auVar4 = vpslld_avx2(auVar4,2);
  vpsubd_avx2(auVar4,auVar1);
  return palVar2;
}

Assistant:

static inline __m128i cross_sum(const int32_t *buf, int stride) {
  const __m128i xtl = xx_loadu_128(buf - 1 - stride);
  const __m128i xt = xx_loadu_128(buf - stride);
  const __m128i xtr = xx_loadu_128(buf + 1 - stride);
  const __m128i xl = xx_loadu_128(buf - 1);
  const __m128i x = xx_loadu_128(buf);
  const __m128i xr = xx_loadu_128(buf + 1);
  const __m128i xbl = xx_loadu_128(buf - 1 + stride);
  const __m128i xb = xx_loadu_128(buf + stride);
  const __m128i xbr = xx_loadu_128(buf + 1 + stride);

  const __m128i fours = _mm_add_epi32(
      xl, _mm_add_epi32(xt, _mm_add_epi32(xr, _mm_add_epi32(xb, x))));
  const __m128i threes =
      _mm_add_epi32(xtl, _mm_add_epi32(xtr, _mm_add_epi32(xbr, xbl)));

  return _mm_sub_epi32(_mm_slli_epi32(_mm_add_epi32(fours, threes), 2), threes);
}